

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::PackUnorm2x16Case::iterate(PackUnorm2x16Case *this)

{
  ulong uVar1;
  Precision PVar2;
  uint uVar3;
  ShaderExecutor *pSVar4;
  uint uVar5;
  deUint32 dVar6;
  uint uVar7;
  pointer pVVar8;
  pointer pVVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  char *description;
  Hex<8UL> hex;
  int iVar13;
  long lVar14;
  Hex<8UL> hex_00;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  void *out;
  Random rnd;
  void *in;
  ostringstream local_1a8 [376];
  undefined1 auVar24 [16];
  
  dVar6 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar6 ^ 0x776002);
  inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PVar2 = this->m_precision;
  if (PVar2 == PRECISION_MEDIUMP) {
    uVar7 = 0x41;
  }
  else if (PVar2 == PRECISION_HIGHP) {
    uVar7 = 1;
  }
  else {
    uVar7 = 0x101;
    if (PVar2 != PRECISION_LOWP) {
      uVar7 = 0;
    }
  }
  in = (void *)0x0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3f8000003f000000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3f0000003f800000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3fc00000bf000000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3f4000003e800000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  iVar13 = 0xf;
  while (bVar17 = iVar13 != 0, iVar13 = iVar13 + -1, bVar17) {
    fVar20 = deRandom_getFloat(&rnd.m_rnd);
    fVar21 = deRandom_getFloat(&rnd.m_rnd);
    in = (void *)CONCAT44(fVar21 * 1.25,fVar20 * 1.25);
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
               (Vector<float,_2> *)&in);
  }
  iVar13 = 0x50;
  while (bVar17 = iVar13 != 0, iVar13 = iVar13 + -1, bVar17) {
    fVar20 = deRandom_getFloat(&rnd.m_rnd);
    fVar21 = deRandom_getFloat(&rnd.m_rnd);
    in = (void *)CONCAT44(fVar21 * 1e+06 + -100000.0,fVar20 * 1e+06 + -100000.0);
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
               (Vector<float,_2> *)&in);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&outputs,(long)inputs.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  in = inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar4 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar4->_vptr_ShaderExecutor[6])
            (pSVar4,(ulong)((long)inputs.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3,&in,&out);
  uVar12 = (long)inputs.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)inputs.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  lVar14 = 0;
  iVar13 = 0;
  pVVar8 = inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar9 = inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    iVar10 = (int)((ulong)((long)pVVar9 - (long)pVVar8) >> 3);
    if (iVar10 <= lVar14) break;
    uVar1 = *(ulong *)pVVar8[lVar14].m_data;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar1;
    auVar23 = minps(ZEXT816(0x3f8000003f800000),auVar23);
    fVar20 = (float)(-(uint)(0.0 <= (float)uVar1) & (uint)(auVar23._0_4_ * 65535.0));
    fVar21 = (float)(-(uint)(0.0 <= (float)(uVar1 >> 0x20)) & (uint)(auVar23._4_4_ * 65535.0));
    iVar18 = -(uint)(fVar20 < 0.0);
    iVar19 = -(uint)(fVar21 < 0.0);
    auVar25._4_4_ = iVar19;
    auVar25._0_4_ = iVar18;
    auVar25._8_4_ = iVar19;
    auVar25._12_4_ = iVar19;
    auVar24._8_8_ = auVar25._8_8_;
    auVar24._4_4_ = iVar18;
    auVar24._0_4_ = iVar18;
    uVar11 = movmskpd(iVar10,auVar24);
    fVar22 = -0.5;
    if ((uVar11 & 1) == 0) {
      fVar22 = 0.5;
    }
    uVar16 = (uint)(fVar22 + fVar20);
    if (0xfffe < (int)uVar16) {
      uVar16 = 0xffff;
    }
    if ((int)uVar16 < 1) {
      uVar16 = 0;
    }
    fVar20 = -0.5;
    if ((uVar11 & 2) == 0) {
      fVar20 = 0.5;
    }
    uVar11 = (uint)(fVar21 + fVar20);
    if (0xfffe < (int)uVar11) {
      uVar11 = 0xffff;
    }
    if ((int)uVar11 < 1) {
      uVar11 = 0;
    }
    uVar3 = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14];
    hex.value._4_4_ = 0;
    hex.value._0_4_ = uVar3;
    uVar15 = uVar16 - (uVar3 & 0xffff);
    uVar5 = -uVar15;
    if (0 < (int)uVar15) {
      uVar5 = uVar15;
    }
    uVar15 = uVar11 - (uVar3 >> 0x10);
    uVar3 = -uVar15;
    if (0 < (int)uVar15) {
      uVar3 = uVar15;
    }
    if ((uVar7 < uVar5) || (uVar7 < uVar3)) {
      if (iVar13 < 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"ERROR: Mismatch in value ");
        std::ostream::operator<<(local_1a8,(int)lVar14);
        std::operator<<((ostream *)local_1a8,", expected packUnorm2x16(");
        tcu::operator<<((ostream *)local_1a8,
                        inputs.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar14);
        std::operator<<((ostream *)local_1a8,") = ");
        hex_00.value._4_4_ = 0;
        hex_00.value._0_4_ = uVar11 << 0x10 | uVar16;
        tcu::Format::operator<<((ostream *)local_1a8,hex_00);
        std::operator<<((ostream *)local_1a8,", got ");
        tcu::Format::operator<<((ostream *)local_1a8,hex);
        std::operator<<((ostream *)local_1a8,"\n  diffs = (");
        std::ostream::operator<<(local_1a8,uVar5);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::operator<<(local_1a8,uVar3);
        std::operator<<((ostream *)local_1a8,"), max diff = ");
        std::ostream::operator<<(local_1a8,uVar7);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      else if (iVar13 == 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      iVar13 = iVar13 + 1;
      pVVar8 = inputs.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar9 = inputs.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    lVar14 = lVar14 + 1;
  }
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar10 = (int)(uVar12 >> 3);
  std::ostream::operator<<(local_1a8,iVar10 - iVar13);
  std::operator<<((ostream *)local_1a8," / ");
  std::ostream::operator<<(local_1a8,iVar10);
  std::operator<<((ostream *)local_1a8," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  description = "Pass";
  if (iVar13 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar13 != 0),description);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&inputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 65	:		// (2^-10) * (2^16) + 1
												  m_precision == glu::PRECISION_LOWP	? 257	: 0;	// (2^-8) * (2^16) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(0.5f, 1.0f));
		inputs.push_back(tcu::Vec2(1.0f, 0.5f));
		inputs.push_back(tcu::Vec2(-0.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*1.25f;
			const float y = rnd.getFloat()*1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 1e5f;
			const float y = rnd.getFloat()*1e6f - 1e5f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), 0.0f, 1.0f) * 65535.0f), 0, (1<<16)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), 0.0f, 1.0f) * 65535.0f), 0, (1<<16)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packUnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}